

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O2

bool FileUtil::readDataLocally
               (string *data_path,vector<Rating,_std::allocator<Rating>_> *ratings,int min_row_index
               ,int max_row_index,int total_rating_num,int row_num)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  long *plVar4;
  ostream *poVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  ulong uVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  value_type_conflict1 *pvVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  ifstream data_file;
  int aiStack_218 [122];
  
  std::ifstream::ifstream(&data_file,(string *)data_path,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(_data_file + -0x18)) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"cannot open ");
    poVar5 = std::operator<<(poVar5,(string *)data_path);
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(1);
  }
  std::istream::seekg((long)&data_file,min_row_index * 8);
  iVar17 = max_row_index - min_row_index;
  uVar9 = 0xffffffffffffffff;
  uVar12 = (long)(iVar17 * 8) * 4;
  if (iVar17 < 0) {
    uVar12 = uVar9;
  }
  pvVar3 = operator_new__(uVar12);
  plVar4 = (long *)std::istream::read((char *)&data_file,(long)pvVar3);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
    std::istream::seekg((long)&data_file,total_rating_num << 3);
    uVar12 = (long)(row_num * 4 + 4) * 4;
    if (row_num < -1) {
      uVar12 = uVar9;
    }
    pvVar6 = operator_new__(uVar12);
    plVar4 = (long *)std::istream::read((char *)&data_file,(long)pvVar6);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
      std::istream::seekg((long)&data_file,min_row_index * 4);
      uVar12 = (long)(iVar17 * 4) * 4;
      if (iVar17 < 0) {
        uVar12 = uVar9;
      }
      pvVar7 = operator_new__(uVar12);
      plVar4 = (long *)std::istream::read((char *)&data_file,(long)pvVar7);
      bVar18 = (*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0;
      if (bVar18) {
        std::vector<Rating,_std::allocator<Rating>_>::resize(ratings,(long)iVar17);
        iVar8 = 0;
        for (uVar9 = 1; uVar9 != (~(row_num >> 0x1f) & row_num) + 1; uVar9 = uVar9 + 1) {
          iVar16 = *(int *)((long)pvVar6 + uVar9 * 4);
          if (min_row_index <= iVar16) {
            iVar2 = *(int *)((long)pvVar6 + uVar9 * 4 + -4);
            iVar11 = min_row_index;
            if ((min_row_index <= iVar2) && (iVar11 = iVar2, max_row_index <= iVar2)) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"Logical error!");
              std::endl<char,std::char_traits<char>>(poVar5);
              bVar18 = false;
              goto LAB_0012d15c;
            }
            uVar14 = iVar16 - iVar2;
            lVar13 = (long)iVar8;
            if (max_row_index - iVar2 <= (int)uVar14) {
              uVar14 = max_row_index - iVar2;
            }
            pvVar15 = &(ratings->super__Vector_base<Rating,_std::allocator<Rating>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar13].score;
            iVar16 = 0;
            while (-(~((int)uVar14 >> 0x1f) & uVar14) != iVar16) {
              ((Rating *)(pvVar15 + -2))->global_id = iVar11;
              *(int *)((long)pvVar15 + -0xc) = (int)uVar9 + -1;
              iVar16 = iVar16 + -1;
              iVar11 = iVar11 + 1;
              *(int *)(pvVar15 + -1) = *(int *)((long)pvVar7 + lVar13 * 4);
              lVar1 = lVar13 * 8;
              lVar13 = lVar13 + 1;
              *pvVar15 = *(value_type_conflict1 *)((long)pvVar3 + lVar1);
              pvVar15 = pvVar15 + 3;
              if (iVar17 <= lVar13) goto LAB_0012d132;
            }
            iVar8 = iVar8 - iVar16;
          }
        }
LAB_0012d132:
        std::ifstream::close();
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in reading col index from file!");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      operator_delete__(pvVar3);
      pvVar10 = pvVar6;
      pvVar3 = pvVar7;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in reading row index from file!");
      std::endl<char,std::char_traits<char>>(poVar5);
      bVar18 = false;
      pvVar10 = pvVar3;
      pvVar3 = pvVar6;
    }
    operator_delete__(pvVar10);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in reading rating values from file!");
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar18 = false;
  }
  operator_delete__(pvVar3);
LAB_0012d15c:
  std::ifstream::~ifstream(&data_file);
  return bVar18;
}

Assistant:

bool readDataLocally(string data_path, vector<Rating> &ratings, const int min_row_index,
                         const int max_row_index, const int total_rating_num, const int row_num) {
        ifstream data_file(data_path);
        if(!data_file.good()){
            cerr << "cannot open " << data_path << endl;
            exit(1);
        }

        long long begin_skip = min_row_index * size_of_double;

        // scores
        data_file.seekg(begin_skip, std::ios_base::cur);

        long long size = (max_row_index - min_row_index) * size_of_double;
        int *score_rows = new int[size];
        if (!data_file.read(reinterpret_cast<char *>(score_rows), size)) {
            cerr << "Error in reading rating values from file!" << endl;
            delete[] score_rows;
            return false;
        }

        double *score_ptr = reinterpret_cast<double *>(score_rows);

        // row_index
        begin_skip = total_rating_num * size_of_double;
        data_file.seekg(begin_skip, std::ios_base::beg);
        long long size2 = size_of_int * (row_num + 1);
        int *row_nums = new int[size2];
        if (!data_file.read(reinterpret_cast<char *>(row_nums), size2)) {
            cerr << "Error in reading row index from file!" << endl;
            delete[] score_rows;
            delete[] row_nums;
            return false;
        }

        // col_index
        begin_skip = min_row_index * size_of_int;
        data_file.seekg(begin_skip, std::ios_base::cur);

        long long size3 = size_of_int * (max_row_index - min_row_index);

        int *col_indices = new int[size3];
        if (!data_file.read(reinterpret_cast<char *>(col_indices), size3)) {
            cerr << "Error in reading col index from file!" << endl;
            delete[] score_rows;
            delete[] row_nums;
            delete[] col_indices;
            return false;
        }

        // format data
        ratings.resize(max_row_index - min_row_index);
        int index = 0;
        int global_id_start = 0;
        int rating_num = 0;
        bool finish = false;
        for (int row_index = 1; row_index < row_num + 1; row_index++) {

            // accumulation includes row of row_index = row_nums[row_index];
            if (row_nums[row_index] < min_row_index) {
                continue;
            } else if (row_nums[row_index - 1] < min_row_index && row_nums[row_index] >= min_row_index) {
                global_id_start = min_row_index;
                rating_num = std::min(max_row_index - row_nums[row_index - 1],
                                      row_nums[row_index] - row_nums[row_index - 1]);
            } else if (row_nums[row_index - 1] >= min_row_index && row_nums[row_index - 1] < max_row_index) {
                global_id_start = row_nums[row_index - 1];
                rating_num = std::min(max_row_index - row_nums[row_index - 1],
                                      row_nums[row_index] - row_nums[row_index - 1]);
            } else {
                cerr << "Logical error!" << endl;
                return false;
            }

            for (int offset = 0; offset < rating_num; offset++) {
                ratings[index].global_id = global_id_start + offset;
                ratings[index].user_id = row_index - 1;
                ratings[index].item_id = col_indices[index];
                ratings[index].score = score_ptr[index];

                index++;
                if (index >= max_row_index - min_row_index) {
                    finish = true;
                    break;
                }
            }

            if (finish) {
                break;
            }
        }

        data_file.close();

        delete[] score_rows;
        delete[] row_nums;
        delete[] col_indices;

        return true;
    }